

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *rhs)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if ((this->l).updateType != 0) {
    solveUleft(this,vec,rhs);
    local_68.m_backend.fpclass = cpp_dec_float_finite;
    local_68.m_backend.prec_elem = 0x10;
    local_68.m_backend.data._M_elems[0] = 0;
    local_68.m_backend.data._M_elems[1] = 0;
    local_68.m_backend.data._M_elems[2] = 0;
    local_68.m_backend.data._M_elems[3] = 0;
    local_68.m_backend.data._M_elems[4] = 0;
    local_68.m_backend.data._M_elems[5] = 0;
    local_68.m_backend.data._M_elems[6] = 0;
    local_68.m_backend.data._M_elems[7] = 0;
    local_68.m_backend.data._M_elems[8] = 0;
    local_68.m_backend.data._M_elems[9] = 0;
    local_68.m_backend.data._M_elems[10] = 0;
    local_68.m_backend.data._M_elems[0xb] = 0;
    local_68.m_backend.data._M_elems[0xc] = 0;
    local_68.m_backend.data._M_elems[0xd] = 0;
    local_68.m_backend.data._M_elems._56_5_ = 0;
    local_68.m_backend.data._M_elems[0xf]._1_3_ = 0;
    local_68.m_backend.exp = 0;
    local_68.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_68,0.0);
    solveLleftForest(this,vec,(int *)0x0,&local_68);
    solveLleft(this,vec);
    return;
  }
  solveUpdateLeft(this,rhs);
  solveUleft(this,vec,rhs);
  solveLleft(this,vec);
  return;
}

Assistant:

void CLUFactor<R>::solveLeft(R* vec, R* rhs)
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      solveUpdateLeft(rhs);
      solveUleft(vec, rhs);
      solveLleft(vec);
   }
   else
   {
      solveUleft(vec, rhs);
      //@todo is 0.0 the right value for eps here ?
      solveLleftForest(vec, nullptr, 0.0);
      solveLleft(vec);
   }
}